

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O0

PBuffer __thiscall ConvertorXMI2MID::create_track(ConvertorXMI2MID *this,MidiNodes *nodes)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  reference pvVar4;
  uint64_t val;
  element_type *peVar5;
  vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PBuffer PVar6;
  shared_ptr<Buffer> local_a8 [2];
  shared_ptr<MutableBuffer> local_88;
  undefined1 local_78 [8];
  MidiNode node;
  uint64_t time;
  undefined1 local_48 [8];
  PMutableBuffer data;
  MidiNodes *nodes_local;
  ConvertorXMI2MID *this_local;
  
  iVar2 = std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::
          begin(in_RDX);
  iVar3 = std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::end
                    (in_RDX);
  std::
  sort<__gnu_cxx::__normal_iterator<ConvertorXMI2MID::MidiNode*,std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>>,ConvertorXMI2MID::create_track(std::vector<ConvertorXMI2MID::MidiNode,std::allocator<ConvertorXMI2MID::MidiNode>>*)::CompareByTime>
            (iVar2._M_current,iVar3._M_current);
  std::make_shared<MutableBuffer,Buffer::EndianessMode>((EndianessMode *)local_48);
  node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while (bVar1 = std::
                 vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::
                 empty(in_RDX), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::
             back(in_RDX);
    MidiNode::MidiNode((MidiNode *)local_78,pvVar4);
    std::vector<ConvertorXMI2MID::MidiNode,_std::allocator<ConvertorXMI2MID::MidiNode>_>::pop_back
              (in_RDX);
    val = (long)local_78 -
          (long)node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    std::shared_ptr<MutableBuffer>::shared_ptr(&local_88,(shared_ptr<MutableBuffer> *)local_48);
    midi_write_variable_size(val,&local_88);
    std::shared_ptr<MutableBuffer>::~shared_ptr(&local_88);
    node.buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
    peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    MutableBuffer::push<unsigned_char>(peVar5,node.time._4_1_,1);
    peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_48);
    MutableBuffer::push<unsigned_char>(peVar5,node.time._5_1_,1);
    if (((node.time._4_1_ & 0xf0) != 0xc0) && ((node.time._4_1_ & 0xf0) != 0xd0)) {
      peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      MutableBuffer::push<unsigned_char>(peVar5,node.time._6_1_,1);
      if ((node.time._4_1_ == 0xff) && (node.time._6_1_ != '\0')) {
        peVar5 = std::__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<MutableBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        std::shared_ptr<Buffer>::shared_ptr(local_a8,(shared_ptr<Buffer> *)&node.index);
        MutableBuffer::push(peVar5,local_a8);
        std::shared_ptr<Buffer>::~shared_ptr(local_a8);
      }
    }
    MidiNode::~MidiNode((MidiNode *)local_78);
  }
  std::shared_ptr<Buffer>::shared_ptr<MutableBuffer,void>
            ((shared_ptr<Buffer> *)this,(shared_ptr<MutableBuffer> *)local_48);
  std::shared_ptr<MutableBuffer>::~shared_ptr((shared_ptr<MutableBuffer> *)local_48);
  PVar6.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar6.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar6.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
ConvertorXMI2MID::create_track(MidiNodes *nodes) {
  class CompareByTime {
   public:
    // Return true if first midi node should come before second.
    bool operator()(const MidiNode &m1, const MidiNode &m2) const {
      if (m1.time != m2.time) {
        return m1.time > m2.time;
      }
      return false;
    }
  };

  // Sort the nodes.
  std::sort(nodes->begin(), nodes->end(), CompareByTime());

  PMutableBuffer data = std::make_shared<MutableBuffer>(Buffer::EndianessBig);
  uint64_t time = 0;
  while (!nodes->empty()) {
    MidiNode node = nodes->back();
    nodes->pop_back();

    midi_write_variable_size(node.time - time, data);
    time = node.time;
    data->push<uint8_t>(node.type);
    data->push<uint8_t>(node.data1);
    if (((node.type & 0xF0) != 0xC0) && ((node.type & 0xF0) != 0xD0)) {
      data->push<uint8_t>(node.data2);
      if (node.type == 0xFF) {
        if (node.data2 > 0) {
          data->push(node.buffer);
        }
      }
    }
  }

  return data;
}